

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::shift_mapping
          (PatternAddressMapper *this,int rows,
          unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
          *aggs_to_move)

{
  _Hash_node_base *p_Var1;
  const_iterator cVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  Aggressor *agg;
  _Hash_node_base *p_Var5;
  undefined1 local_b8 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> movable_ids;
  set<int,_std::less<int>,_std::allocator<int>_> occupied_rows;
  unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
  *__range1;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&occupied_rows;
  occupied_rows._M_t._M_impl._0_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])&movable_ids._M_h._M_rehash_policy._M_next_resize;
  movable_ids._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  movable_ids._M_h._M_bucket_count = 0;
  movable_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  movable_ids._M_h._M_element_count._0_4_ = 0x3f800000;
  movable_ids._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  movable_ids._M_h._M_rehash_policy._4_4_ = 0;
  movable_ids._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var4 = (aggs_to_move->_M_h)._M_before_begin._M_nxt;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)aggs_to_move;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var4[5]._M_nxt;
      for (p_Var5 = p_Var4[4]._M_nxt; p_Var5 != p_Var1;
          p_Var5 = (_Hash_node_base *)((long)&p_Var5->_M_nxt + 4)) {
        local_38 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_b8;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_b8,p_Var5,&local_38);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  p_Var4 = (this->aggressor_to_addr)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      if (*(long *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) == 0) {
LAB_0013d8f4:
        p_Var5 = (_Hash_node_base *)((long)&(p_Var4[3]._M_nxt)->_M_nxt + (long)rows);
        p_Var4[3]._M_nxt = p_Var5;
        local_38 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)CONCAT44(local_38._4_4_,(int)p_Var5);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &movable_ids._M_h._M_single_bucket,(int *)&local_38);
      }
      else {
        cVar2 = std::
                _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_b8,(key_type_conflict *)(p_Var4 + 1));
        if (cVar2.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0)
        goto LAB_0013d8f4;
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  this->min_row =
       (long)(int)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color;
  lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&occupied_rows);
  this->max_row = (long)*(int *)(lVar3 + 0x20);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &movable_ids._M_h._M_single_bucket);
  return;
}

Assistant:

void PatternAddressMapper::shift_mapping(int rows, const std::unordered_set<AggressorAccessPattern> &aggs_to_move) {
  std::set<int> occupied_rows;

  // collect the aggressor ID of the aggressors given in the aggs_to_move set
  std::unordered_set<AGGRESSOR_ID_TYPE> movable_ids;
  for (const auto &agg_pair : aggs_to_move) {
    for (const auto &agg : agg_pair.aggressors) {
      movable_ids.insert(agg.id);
    }
  }

  for (auto &agg_acc_patt : aggressor_to_addr) {
    // if aggs_to_move is empty, we consider it as 'move all aggressors'; otherwise we check whether the current
    // aggressor ID is in aggs_to_move prior shifting the aggressor by the given number of rows (param: rows)
    if (aggs_to_move.empty() || movable_ids.count(agg_acc_patt.first) > 0) {
      agg_acc_patt.second.row += rows;
      occupied_rows.insert(static_cast<int>(agg_acc_patt.second.row));
    }
  }

  // this works as sets are always ordered
  min_row = *occupied_rows.begin();
  max_row = *occupied_rows.rbegin();
}